

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_id.c
# Opt level: O0

int csp_id_is_broadcast(uint16_t addr,csp_iface_t *iface)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  ushort *in_RSI;
  ushort in_DI;
  uint16_t netmask;
  uint16_t hostmask;
  int local_4;
  
  uVar3 = csp_id_get_host_bits();
  uVar1 = (short)(1 << ((char)uVar3 - (char)in_RSI[1] & 0x1fU)) - 1;
  uVar3 = csp_id_get_host_bits();
  uVar2 = ((short)(1 << ((byte)uVar3 & 0x1f)) + -1) - uVar1;
  if (((in_DI & uVar1) == uVar1) && ((in_DI & uVar2) == (*in_RSI & uVar2))) {
    local_4 = 1;
  }
  else {
    uVar3 = csp_id_get_max_nodeid();
    if (in_DI == uVar3) {
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int csp_id_is_broadcast(uint16_t addr, csp_iface_t * iface) {
	uint16_t hostmask = (1 << (csp_id_get_host_bits() - iface->netmask)) - 1;
	uint16_t netmask = (1 << csp_id_get_host_bits()) - 1 - hostmask;
	if (((addr & hostmask) == hostmask) && ((addr & netmask) == (iface->addr & netmask))) {
		return 1;
	}

	if (addr == csp_id_get_max_nodeid()) {
		return 1;
	}
	return 0;
}